

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
zmq::decode<std::back_insert_iterator<std::vector<zmq::message_t,std::allocator<zmq::message_t>>>>
          (message_t *encoded,
          back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_> out)

{
  uint32_t uVar1;
  byte *pbVar2;
  size_t sVar3;
  out_of_range *this;
  byte *buf;
  ulong size_;
  byte *pbVar4;
  message_t local_70;
  
  pbVar2 = (byte *)message_t::data(encoded);
  sVar3 = message_t::size(encoded);
  pbVar4 = pbVar2 + sVar3;
  while( true ) {
    if (pbVar4 <= pbVar2) {
      if (pbVar2 == pbVar4) {
        return (back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>)
               (back_insert_iterator<std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>)
               out.container;
      }
      __assert_fail("source == limit",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                    ,0x166,
                    "OutputIt zmq::decode(const message_t &, OutputIt) [OutputIt = std::back_insert_iterator<std::vector<zmq::message_t>>]"
                   );
    }
    buf = pbVar2 + 1;
    size_ = (ulong)*pbVar2;
    if (size_ == 0xff) {
      if ((ulong)((long)pbVar4 - (long)buf) < 4) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"Malformed encoding, overflow in reading size");
        goto LAB_001462b1;
      }
      uVar1 = detail::read_u32_network_order(buf);
      size_ = (ulong)uVar1;
      buf = pbVar2 + 5;
    }
    if ((ulong)((long)pbVar4 - (long)buf) < size_) break;
    message_t::message_t(&local_70,buf,size_);
    std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>::emplace_back<zmq::message_t>
              (out.container,&local_70);
    message_t::~message_t(&local_70);
    pbVar2 = buf + size_;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Malformed encoding, overflow in reading part");
LAB_001462b1:
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

OutputIt decode(const message_t &encoded, OutputIt out)
{
    const unsigned char *source = encoded.data<unsigned char>();
    const unsigned char *const limit = source + encoded.size();

    while (source < limit) {
        size_t part_size = *source++;
        if (part_size == (std::numeric_limits<std::uint8_t>::max)()) {
            if (static_cast<size_t>(limit - source) < sizeof(uint32_t)) {
                throw std::out_of_range(
                  "Malformed encoding, overflow in reading size");
            }
            part_size = detail::read_u32_network_order(source);
            // the part size is allowed to be less than 0xFF
            source += sizeof(uint32_t);
        }

        if (static_cast<size_t>(limit - source) < part_size) {
            throw std::out_of_range("Malformed encoding, overflow in reading part");
        }
        *out = message_t(source, part_size);
        ++out;
        source += part_size;
    }

    assert(source == limit);
    return out;
}